

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_if_acmpeq(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  Value VVar2;
  Value VVar3;
  undefined2 local_4a;
  int16_t branchOffset;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Value value1;
  Value value2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  code._4_4_ = VVar3.type;
  if (code._4_4_ != REFERENCE) {
    __assert_fail("value1.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xcbe,"void ExecutionEngine::i_if_acmpeq()");
  }
  value1.data.longValue._4_4_ = VVar2.type;
  if (value1.data.longValue._4_4_ == 9) {
    value1._0_8_ = VVar3.data;
    value2._0_8_ = VVar2.data;
    if (value1._0_8_ == value2._0_8_) {
      puVar1 = Frame::getCode(this_01,this_01->pc);
      local_4a = CONCAT11(puVar1[1],puVar1[2]);
      this_01->pc = (int)local_4a + this_01->pc;
    }
    else {
      this_01->pc = this_01->pc + 3;
    }
    return;
  }
  __assert_fail("value2.type == ValueType::REFERENCE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xcbf,"void ExecutionEngine::i_if_acmpeq()");
}

Assistant:

void ExecutionEngine::i_if_acmpeq() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value2 = topFrame->popTopOfOperandStack();
	Value value1 = topFrame->popTopOfOperandStack();
	assert(value1.type == ValueType::REFERENCE);
	assert(value2.type == ValueType::REFERENCE);
	
	if (value1.data.object == value2.data.object) {
		u1 *code = topFrame->getCode(topFrame->pc);
		u1 byte1 = code[1];
		u1 byte2 = code[2];
		int16_t branchOffset = (byte1 << 8) | byte2;
		topFrame->pc += branchOffset;
    } else {
		topFrame->pc += 3;
    }
}